

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p_crypto.c
# Opt level: O3

_Bool i2p_dest_load(i2p_dest *dest,uint8_t *data,size_t sz)

{
  ushort uVar1;
  ushort uVar2;
  _Bool _Var3;
  long lVar4;
  uint8_t *puVar5;
  
  memcpy(dest,data,sz);
  dest->sz = sz;
  dest->enckey = dest->buf;
  if (dest->buf[0x180] == '\0') {
    dest->sigtype = 0;
    dest->enctype = 0;
    dest->sigkey = dest->buf + 0x100;
    (dest->cert).type = '\0';
    (dest->cert).sz = 0;
    lVar4 = 0x228;
    puVar5 = (uint8_t *)0x0;
LAB_0010613a:
    *(uint8_t **)(dest->buf + lVar4) = puVar5;
    _Var3 = true;
  }
  else {
    if (dest->buf[0x180] == '\x05') {
      (dest->cert).type = '\x05';
      uVar1 = *(ushort *)(dest->buf + 0x185);
      (dest->cert).sz = *(ushort *)(dest->buf + 0x181) << 8 | *(ushort *)(dest->buf + 0x181) >> 8;
      uVar2 = *(ushort *)(dest->buf + 0x183);
      dest->sigtype = uVar2 << 8 | uVar2 >> 8;
      dest->enctype = uVar1 << 8 | uVar1 >> 8;
      if (uVar2 == 0x700) {
        puVar5 = dest->buf + 0x160;
        lVar4 = 0x218;
        goto LAB_0010613a;
      }
    }
    _Var3 = false;
  }
  return _Var3;
}

Assistant:

bool i2p_dest_load(struct i2p_dest * dest, uint8_t * data, size_t sz)
{
  uint8_t * ptr = dest->buf;
  memcpy(ptr, data, sz);
  dest->sz = sz;
  dest->enckey = ptr;
  ptr += 256 + 128;
  if(*ptr == CERT_KEYCERT)
  {
    dest->cert.type = CERT_KEYCERT;
    ptr ++;
    dest->cert.sz = bufbe16toh(ptr);
    ptr += 2;
    dest->sigtype = bufbe16toh(ptr);
    ptr += 2;
    dest->enctype = bufbe16toh(ptr);
    if(dest->sigtype == EDDSA_KEYTYPE)
    {
      dest->sigkey = dest->buf + 256 + EDDSA_PADDING_BYTES;
      return true;
    }
  }
  else if(*ptr == CERT_NULL)
  {
    dest->sigtype = DSA_KEYTYPE;
    dest->enctype = ELG_KEYTYPE;
    dest->sigkey = dest->buf + 256;
    dest->cert.type = CERT_NULL;
    dest->cert.sz = 0;
    dest->cert.data = 0;
    return true;
  }
  return false;
}